

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_engine.cpp
# Opt level: O0

void __thiscall
polyscope::render::backend_openGL3_glfw::GLTextureBuffer::GLTextureBuffer
          (GLTextureBuffer *this,TextureFormat format_,uint size1D,float *data)

{
  PFNGLTEXIMAGE1DPROC p_Var1;
  GLenum GVar2;
  GLenum GVar3;
  void *in_RCX;
  GLsizei in_EDX;
  long *in_RDI;
  bool in_stack_00000067;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  GLsizei GVar4;
  int in_stack_ffffffffffffffdc;
  TextureBuffer *in_stack_ffffffffffffffe0;
  
  GVar4 = 1;
  TextureBuffer::TextureBuffer
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc,RGBA8,(uint)((ulong)in_RDI >> 0x20)
             ,(uint)in_RDI);
  *in_RDI = (long)&PTR__GLTextureBuffer_00795fe0;
  (*glad_glGenTextures)(GVar4,(GLuint *)(in_RDI + 3));
  (*glad_glBindTexture)(0xde0,*(GLuint *)(in_RDI + 3));
  p_Var1 = glad_glTexImage1D;
  GVar2 = internalFormat((TextureFormat *)
                         CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  GVar3 = formatF((TextureFormat *)CONCAT44(GVar2,in_stack_ffffffffffffffc8));
  (*p_Var1)(0xde0,0,GVar2,in_EDX,0,GVar3,0x1406,in_RCX);
  checkGLError(in_stack_00000067);
  (**(code **)(*in_RDI + 0x20))(in_RDI,0);
  return;
}

Assistant:

GLTextureBuffer::GLTextureBuffer(TextureFormat format_, unsigned int size1D, float* data)
    : TextureBuffer(1, format_, size1D) {

  glGenTextures(1, &handle);
  glBindTexture(GL_TEXTURE_1D, handle);
  glTexImage1D(GL_TEXTURE_1D, 0, internalFormat(format), size1D, 0, formatF(format), GL_FLOAT, data);
  checkGLError();

  setFilterMode(FilterMode::Nearest);
}